

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12d80::AckermannTask::inputsAvailable(AckermannTask *this,TaskInterface ti)

{
  int iVar1;
  ValueType local_70;
  ValueType local_58;
  AckermannValue local_3c;
  ValueType local_38;
  AckermannTask *local_20;
  AckermannTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (AckermannTask *)ti.impl;
  local_20 = this;
  if (this->m == 0) {
    AckermannValue::AckermannValue(&local_3c,this->n + 1);
    (anonymous_namespace)::AckermannValue::operator_cast_to_vector
              (&local_38,(AckermannValue *)&local_3c);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  }
  else {
    iVar1 = (anonymous_namespace)::AckermannValue::operator_cast_to_int
                      ((AckermannValue *)&this->recursiveResultA);
    if (iVar1 == 0) {
      __assert_fail("recursiveResultA != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                    ,0xb4,
                    "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                   );
    }
    if (this->n == 0) {
      (anonymous_namespace)::AckermannValue::operator_cast_to_vector
                (&local_58,(AckermannValue *)&this->recursiveResultA);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_58,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
    }
    else {
      iVar1 = (anonymous_namespace)::AckermannValue::operator_cast_to_int
                        ((AckermannValue *)&this->recursiveResultB);
      if (iVar1 == 0) {
        __assert_fail("recursiveResultB != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/BuildEngineCommand.cpp"
                      ,0xba,
                      "virtual void (anonymous namespace)::AckermannTask::inputsAvailable(core::TaskInterface)"
                     );
      }
      (anonymous_namespace)::AckermannValue::operator_cast_to_vector
                (&local_70,(AckermannValue *)&this->recursiveResultB);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_70,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
    }
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
    if (m == 0) {
      ti.complete(AckermannValue(n + 1));
      return;
    }

    assert(recursiveResultA != 0);
    if (n == 0) {
      ti.complete(recursiveResultA);
      return;
    }

    assert(recursiveResultB != 0);
    ti.complete(recursiveResultB);
  }